

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_mp3_seek_forward_by_pcm_frames__brute_force(ma_dr_mp3 *pMP3,ma_uint64 frameOffset)

{
  ma_dr_mp3 *pmVar1;
  ma_dr_mp3 *in_RSI;
  ma_uint64 framesRead;
  ma_int16 *in_stack_ffffffffffffffd8;
  ma_uint64 in_stack_ffffffffffffffe0;
  uint local_4;
  
  pmVar1 = (ma_dr_mp3 *)
           ma_dr_mp3_read_pcm_frames_s16(in_RSI,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  local_4 = (uint)(pmVar1 == in_RSI);
  return local_4;
}

Assistant:

static ma_bool32 ma_dr_mp3_seek_forward_by_pcm_frames__brute_force(ma_dr_mp3* pMP3, ma_uint64 frameOffset)
{
    ma_uint64 framesRead;
#if defined(MA_DR_MP3_FLOAT_OUTPUT)
    framesRead = ma_dr_mp3_read_pcm_frames_f32(pMP3, frameOffset, NULL);
#else
    framesRead = ma_dr_mp3_read_pcm_frames_s16(pMP3, frameOffset, NULL);
#endif
    if (framesRead != frameOffset) {
        return MA_FALSE;
    }
    return MA_TRUE;
}